

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v7::detail::
       parse_replacement_field<char,fmt::v7::detail::format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>&>
                 (char *begin,char *end,
                 format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                 *handler)

{
  int id;
  undefined1 value [16];
  undefined1 value_00 [16];
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_00;
  error_handler *begin_00;
  size_t sVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_01;
  error_handler *__last;
  ulong uVar2;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_1
  *__return_storage_ptr__;
  error_handler *peVar3;
  basic_format_specs<char> specs;
  format_arg arg;
  id_adapter<fmt::v7::detail::format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_&,_char>
  adapter;
  unkbyte10 in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff72;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_1
  local_88;
  int local_78;
  id_adapter<fmt::v7::detail::format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_&,_char>
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  buffer<char> *local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  begin_00 = (error_handler *)(begin + 1);
  if (begin_00 == (error_handler *)end) {
    error_handler::on_error((error_handler *)begin,"invalid format string");
  }
  if (*begin_00 == (error_handler)0x7b) {
    out_01.container = (handler->context).out_.container;
    __last = (error_handler *)(begin + 2);
    peVar3 = begin_00;
  }
  else {
    if (*begin_00 != (error_handler)0x7d) {
      local_68.arg_id = 0;
      peVar3 = begin_00;
      local_68.handler = handler;
      begin_00 = (error_handler *)
                 parse_arg_id<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>&,char>&>
                           ((char *)begin_00,end,&local_68);
      if (begin_00 == (error_handler *)end) {
LAB_00484541:
        error_handler::on_error(peVar3,"missing \'}\' in format string");
      }
      if (*begin_00 == (error_handler)0x3a) {
        begin_00 = (error_handler *)
                   format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                   ::on_format_specs(handler,local_68.arg_id,(char *)(begin_00 + 1),end);
        if ((begin_00 == (error_handler *)end) || (*begin_00 != (error_handler)0x7d)) {
          error_handler::on_error((error_handler *)handler,"unknown format specifier");
        }
        goto LAB_004843ac;
      }
      if (*begin_00 != (error_handler)0x7d) goto LAB_00484541;
      __return_storage_ptr__ = &local_88;
      basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
      ::get((format_arg *)&__return_storage_ptr__->string,&(handler->context).args_,local_68.arg_id)
      ;
      if (local_78 == 0) goto LAB_0048454d;
      if (0xe < local_78 - 1U) goto LAB_00484571;
      out_01.container = (handler->context).out_.container;
      switch(local_78) {
      case 2:
        goto switchD_004842e3_caseD_2;
      case 3:
        goto switchD_004842e3_caseD_3;
      case 4:
        goto switchD_004842e3_caseD_4;
      case 5:
        goto switchD_004842e3_caseD_5;
      case 6:
        goto switchD_004842e3_caseD_6;
      case 7:
        goto switchD_004842e3_caseD_7;
      case 8:
        goto switchD_004842e3_caseD_8;
      case 9:
        goto switchD_004842e3_caseD_9;
      case 10:
        goto switchD_004842e3_caseD_a;
      case 0xb:
        goto switchD_004842e3_caseD_b;
      case 0xc:
        goto switchD_004842e3_caseD_c;
      case 0xd:
        goto switchD_004842e3_caseD_d;
      case 0xe:
        goto switchD_004842e3_caseD_e;
      case 0xf:
        goto switchD_004842e3_caseD_f;
      }
switchD_004842e3_caseD_1:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_int,_0>
                (out_01,local_88.int_value);
      goto LAB_004843ac;
    }
    id = (handler->parse_context).next_arg_id_;
    if (id < 0) {
      error_handler::on_error
                ((error_handler *)begin,"cannot switch from manual to automatic argument indexing");
    }
    (handler->parse_context).next_arg_id_ = id + 1;
    __return_storage_ptr__ = &local_88;
    basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
    ::get((format_arg *)&__return_storage_ptr__->string,&(handler->context).args_,id);
    if (local_78 == 0) {
LAB_0048454d:
      error_handler::on_error((error_handler *)&__return_storage_ptr__->string,"argument not found")
      ;
    }
    if (0xe < local_78 - 1U) {
LAB_00484571:
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/include/fmt/format.h"
                  ,0x7d7,"");
    }
    out_01.container = (handler->context).out_.container;
    switch(local_78) {
    case 1:
      goto switchD_004842e3_caseD_1;
    case 2:
switchD_004842e3_caseD_2:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_int,_0>
                (out_01,local_88.uint_value);
      goto LAB_004843ac;
    case 3:
switchD_004842e3_caseD_3:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_long_long,_0>
                (out_01,CONCAT44(local_88.long_long_value._4_4_,local_88.int_value));
      goto LAB_004843ac;
    case 4:
switchD_004842e3_caseD_4:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_long_long,_0>
                (out_01,CONCAT44(local_88.long_long_value._4_4_,local_88.int_value));
      goto LAB_004843ac;
    case 5:
switchD_004842e3_caseD_5:
      out.container._4_4_ = local_88.long_long_value._4_4_;
      out.container._0_4_ = local_88.int_value;
      value._10_6_ = in_stack_ffffffffffffff72;
      value._0_10_ = in_stack_ffffffffffffff68;
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,___int128,_0>
                ((detail *)out_01.container,out,(__int128)value);
      goto LAB_004843ac;
    case 6:
switchD_004842e3_caseD_6:
      out_00.container._4_4_ = local_88.long_long_value._4_4_;
      out_00.container._0_4_ = local_88.int_value;
      value_00._10_6_ = in_stack_ffffffffffffff72;
      value_00._0_10_ = in_stack_ffffffffffffff68;
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned___int128,_0>
                ((detail *)out_01.container,out_00,(unsigned___int128)value_00);
      goto LAB_004843ac;
    case 7:
switchD_004842e3_caseD_7:
      peVar3 = (error_handler *)0x4e8874;
      if ((ulong)local_88.bool_value != 0) {
        peVar3 = (error_handler *)0x585737;
      }
      uVar2 = (ulong)local_88.bool_value ^ 5;
      break;
    case 8:
switchD_004842e3_caseD_8:
      sVar1 = (out_01.container)->size_;
      uVar2 = sVar1 + 1;
      if ((out_01.container)->capacity_ < uVar2) {
        (**(out_01.container)->_vptr_buffer)(out_01.container);
        sVar1 = (out_01.container)->size_;
        uVar2 = sVar1 + 1;
      }
      (out_01.container)->size_ = uVar2;
      (out_01.container)->ptr_[sVar1] = local_88.bool_value;
      goto LAB_004843ac;
    case 9:
switchD_004842e3_caseD_9:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_float,_0>
                (out_01,local_88.float_value);
      goto LAB_004843ac;
    case 10:
switchD_004842e3_caseD_a:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_double,_0>
                (out_01,(double)CONCAT44(local_88.long_long_value._4_4_,local_88.int_value));
      goto LAB_004843ac;
    case 0xb:
switchD_004842e3_caseD_b:
      specs.type = '\0';
      specs._9_1_ = 0;
      specs.fill.data_[0] = ' ';
      specs.fill.data_[1] = '\0';
      specs.fill.data_[2] = '\0';
      specs.fill.data_[3] = '\0';
      specs.fill.size_ = '\x01';
      specs._15_1_ = 0;
      specs.width = 0;
      specs.precision = -1;
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_long_double,_0>
                (out_01,(longdouble)
                        CONCAT28(local_88.int128_value._8_2_,
                                 CONCAT44(local_88.long_long_value._4_4_,local_88.int_value)),specs,
                 (locale_ref)0x0);
      goto LAB_004843ac;
    case 0xc:
switchD_004842e3_caseD_c:
      write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                (out_01,(char *)CONCAT44(local_88.long_long_value._4_4_,local_88.int_value));
      goto LAB_004843ac;
    case 0xd:
switchD_004842e3_caseD_d:
      peVar3 = (error_handler *)CONCAT44(local_88.long_long_value._4_4_,local_88.int_value);
      uVar2 = CONCAT62(local_88.int128_value._10_6_,local_88.int128_value._8_2_);
      break;
    case 0xe:
switchD_004842e3_caseD_e:
      write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>
                (out_01,CONCAT44(local_88.long_long_value._4_4_,local_88.int_value),
                 (basic_format_specs<char> *)0x0);
      goto LAB_004843ac;
    case 0xf:
switchD_004842e3_caseD_f:
      local_38 = *(undefined8 *)&(handler->context).args_;
      local_58 = 0;
      uStack_50 = 0;
      local_48 = 0;
      local_30 = *(undefined4 *)&(handler->context).field_0x10;
      uStack_2c = *(undefined4 *)&(handler->context).field_0x14;
      uStack_28 = *(undefined4 *)&(handler->context).loc_.locale_;
      uStack_24 = *(undefined4 *)((long)&(handler->context).loc_.locale_ + 4);
      local_40 = out_01.container;
      (*(code *)CONCAT62(local_88.int128_value._10_6_,local_88.int128_value._8_2_))
                (CONCAT44(local_88.long_long_value._4_4_,local_88.int_value));
      goto LAB_004843ac;
    }
    __last = peVar3 + uVar2;
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char_const*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
            ((char *)peVar3,(char *)__last,out_01);
LAB_004843ac:
  return (char *)(begin_00 + 1);
}

Assistant:

FMT_CONSTEXPR const Char* parse_replacement_field(const Char* begin,
                                                  const Char* end,
                                                  Handler&& handler) {
  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (*begin == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter<Handler, Char>{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}